

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_getbase(HSQUIRRELVM v,SQInteger idx)

{
  SQClass *x;
  bool bVar1;
  SQRESULT SVar2;
  SQObjectPtr *o;
  SQObjectPtr local_20;
  
  o = (SQObjectPtr *)0x0;
  bVar1 = sq_aux_gettypedarg(v,idx,OT_CLASS,&o);
  if (bVar1) {
    x = ((o->super_SQObject)._unVal.pClass)->_base;
    if (x == (SQClass *)0x0) {
      SQVM::PushNull(v);
    }
    else {
      SQObjectPtr::SQObjectPtr(&local_20,x);
      SQVM::Push(v,&local_20);
      SQObjectPtr::~SQObjectPtr(&local_20);
    }
    SVar2 = 0;
  }
  else {
    SVar2 = -1;
  }
  return SVar2;
}

Assistant:

SQRESULT sq_getbase(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    if(_class(*o)->_base)
        v->Push(SQObjectPtr(_class(*o)->_base));
    else
        v->PushNull();
    return SQ_OK;
}